

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void assertVersion(char *prog,char *base)

{
  wchar_t wVar1;
  size_t l;
  ushort **ppuVar2;
  bool bVar3;
  size_t prog_len;
  size_t s;
  char *q;
  char *p;
  char *pcStack_18;
  wchar_t r;
  char *base_local;
  char *prog_local;
  
  pcStack_18 = base;
  base_local = prog;
  l = strlen(base);
  p._4_4_ = systemf("%s --version >version.stdout 2>version.stderr",base_local);
  if (p._4_4_ != L'\0') {
    p._4_4_ = systemf("%s -W version >version.stdout 2>version.stderr",base_local);
  }
  failure("Unable to run either %s --version or %s -W version",base_local,base_local);
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                           ,L'ॱ',(uint)(p._4_4_ == L'\0'),"r == 0",(void *)0x0);
  if (wVar1 != L'\0') {
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
               ,L'ॵ',"version.stderr");
    s = (size_t)slurpfile(&prog_len,"version.stdout");
    q = (char *)s;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                     ,L'ॻ',(uint)(l + 1 < prog_len),"s > prog_len + 1",(void *)0x0);
    failure("Version must start with \'%s\': ``%s\'\'",pcStack_18,q);
    wVar1 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                ,L'ॾ',(void *)s,"q",pcStack_18,"base",l,"prog_len",(void *)0x0);
    if (wVar1 == L'\0') {
      free(q);
    }
    else {
      s = l + s;
      prog_len = prog_len - l;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                       ,L'অ',(uint)(*(char *)s == ' '),"*q == \' \'",(void *)0x0);
      s = s + 1;
      prog_len = prog_len - 1;
      assert_version_id((char **)&s,&prog_len);
      failure("No `-\' between program name and versions: ``%s\'\'",q);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                          ,L'ঌ',(void *)s,"q","- ","\"- \"",2,"2",(void *)0x0);
      s = s + 2;
      prog_len = prog_len - 2;
      failure("Not long enough for libarchive version: ``%s\'\'",q);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                       ,L'ঐ',(uint)(0xb < prog_len),"s > 11",(void *)0x0);
      failure("Libarchive version must start with `libarchive\': ``%s\'\'",q);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                          ,L'ও',(void *)s,"q","libarchive ","\"libarchive \"",0xb,"11",(void *)0x0
                         );
      s = s + 0xb;
      prog_len = prog_len - 0xb;
      assert_version_id((char **)&s,&prog_len);
      while( true ) {
        bVar3 = false;
        if ((((prog_len != 0) && (bVar3 = true, *(char *)s != ' ')) &&
            (bVar3 = true, *(char *)s != '-')) &&
           ((bVar3 = true, *(char *)s != '/' && (bVar3 = true, *(char *)s != '.')))) {
          ppuVar2 = __ctype_b_loc();
          bVar3 = ((*ppuVar2)[(int)(uint)*(byte *)s] & 8) != 0;
        }
        if (!bVar3) break;
        s = s + 1;
        prog_len = prog_len - 1;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                       ,L'ড',(uint)(prog_len != 0),"s >= 1",(void *)0x0);
      failure("Version output must end with \\n or \\r\\n");
      if (*(char *)s == '\r') {
        s = s + 1;
        prog_len = prog_len - 1;
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                          ,L'ধ',(void *)s,"q","\n","\"\\n\"",1,"1",(void *)0x0);
      free(q);
    }
  }
  return;
}

Assistant:

void assertVersion(const char *prog, const char *base)
{
	int r;
	char *p, *q;
	size_t s;
	size_t prog_len = strlen(base);

	r = systemf("%s --version >version.stdout 2>version.stderr", prog);
	if (r != 0)
		r = systemf("%s -W version >version.stdout 2>version.stderr",
		    prog);

	failure("Unable to run either %s --version or %s -W version",
		prog, prog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stdout. */
	assertEmptyFile("version.stderr");

	/* Verify format of version message. */
	q = p = slurpfile(&s, "version.stdout");

	/* Version message should start with name of program, then space. */
	assert(s > prog_len + 1);

	failure("Version must start with '%s': ``%s''", base, p);
	if (!assertEqualMem(q, base, prog_len)) {
		free(p);
		return;
	}

	q += prog_len; s -= prog_len;

	assert(*q == ' ');
	q++; s--;

	assert_version_id(&q, &s);

	/* Separator. */
	failure("No `-' between program name and versions: ``%s''", p);
	assertEqualMem(q, "- ", 2);
	q += 2; s -= 2;

	failure("Not long enough for libarchive version: ``%s''", p);
	assert(s > 11);

	failure("Libarchive version must start with `libarchive': ``%s''", p);
	assertEqualMem(q, "libarchive ", 11);

	q += 11; s -= 11;

	assert_version_id(&q, &s);

	/* Skip arbitrary third-party version numbers. */
	while (s > 0 && (*q == ' ' || *q == '-' || *q == '/' || *q == '.' ||
	    isalnum((unsigned char)*q))) {
		++q;
		--s;
	}

	/* All terminated by end-of-line. */
	assert(s >= 1);

	/* Skip an optional CR character (e.g., Windows) */
	failure("Version output must end with \\n or \\r\\n");

	if (*q == '\r') { ++q; --s; }
	assertEqualMem(q, "\n", 1);

	free(p);
}